

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<long>::TPZVec(TPZVec<long> *this,int64_t size,long *copy)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  this->fStore = (long *)0x0;
  if (size < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<long>::TPZVec(const int64_t, const T &) [T = long]");
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size == 0) {
      plVar2 = (long *)0x0;
    }
    else {
      plVar2 = (long *)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
      this->fStore = plVar2;
    }
    this->fNElements = size;
    this->fNAlloc = size;
    lVar1 = *copy;
    for (lVar3 = 0; size != lVar3; lVar3 = lVar3 + 1) {
      plVar2[lVar3] = lVar1;
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}